

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_> __thiscall
Parser::parseUnaryExpr(Parser *this)

{
  Parser *in_RSI;
  unique_ptr<AST::FnCall,_std::default_delete<AST::FnCall>_> local_108;
  undefined1 local_100 [8];
  unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_> arg;
  vector<std::unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_>,_std::allocator<std::unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_>_>_>
  args;
  __single_object id;
  unique_ptr<AST::BooleanLit,_std::default_delete<AST::BooleanLit>_> local_d0;
  undefined1 local_c1;
  unique_ptr<AST::BooleanLit,_std::default_delete<AST::BooleanLit>_> local_c0;
  undefined1 local_b8 [16];
  string lit_2;
  string local_88 [8];
  string lit_1;
  string local_60 [8];
  string lit;
  unique_ptr<AST::UnaryExpr,_std::default_delete<AST::UnaryExpr>_> local_30;
  undefined1 local_28 [8];
  unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_> operand;
  TokenType op;
  Parser *this_local;
  unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_> *expr;
  
  if (((((in_RSI->m_currToken).type == Plus) || ((in_RSI->m_currToken).type == Minus)) ||
      ((in_RSI->m_currToken).type == Bang)) || ((in_RSI->m_currToken).type == Ampersand)) {
    operand._M_t.super___uniq_ptr_impl<AST::Expr,_std::default_delete<AST::Expr>_>._M_t.
    super__Tuple_impl<0UL,_AST::Expr_*,_std::default_delete<AST::Expr>_>.
    super__Head_base<0UL,_AST::Expr_*,_false>._M_head_impl._4_4_ = (in_RSI->m_currToken).type;
    eatToken(in_RSI,(in_RSI->m_currToken).type);
    parseUnaryExpr((Parser *)local_28);
    std::
    make_unique<AST::UnaryExpr,TokenType&,std::unique_ptr<AST::Expr,std::default_delete<AST::Expr>>>
              ((TokenType *)&local_30,
               (unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_> *)
               ((long)&operand._M_t.
                       super___uniq_ptr_impl<AST::Expr,_std::default_delete<AST::Expr>_>._M_t.
                       super__Tuple_impl<0UL,_AST::Expr_*,_std::default_delete<AST::Expr>_>.
                       super__Head_base<0UL,_AST::Expr_*,_false>._M_head_impl + 4));
    std::unique_ptr<AST::Expr,std::default_delete<AST::Expr>>::
    unique_ptr<AST::UnaryExpr,std::default_delete<AST::UnaryExpr>,void>
              ((unique_ptr<AST::Expr,std::default_delete<AST::Expr>> *)this,&local_30);
    std::unique_ptr<AST::UnaryExpr,_std::default_delete<AST::UnaryExpr>_>::~unique_ptr(&local_30);
    std::unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_>::~unique_ptr
              ((unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_> *)local_28);
  }
  else if ((in_RSI->m_currToken).type == LeftParen) {
    eatToken(in_RSI,(in_RSI->m_currToken).type);
    lit.field_2._M_local_buf[0xb] = '\0';
    parseExpr(this);
    eatToken(in_RSI,RightParen);
  }
  else if ((in_RSI->m_currToken).type == String) {
    std::__cxx11::string::string(local_60,(string *)&(in_RSI->m_currToken).literal);
    eatToken(in_RSI,(in_RSI->m_currToken).type);
    std::make_unique<AST::StringLit,std::__cxx11::string&>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&lit_1.field_2 + 8));
    std::unique_ptr<AST::Expr,std::default_delete<AST::Expr>>::
    unique_ptr<AST::StringLit,std::default_delete<AST::StringLit>,void>
              ((unique_ptr<AST::Expr,std::default_delete<AST::Expr>> *)this,
               (unique_ptr<AST::StringLit,_std::default_delete<AST::StringLit>_> *)
               ((long)&lit_1.field_2 + 8));
    std::unique_ptr<AST::StringLit,_std::default_delete<AST::StringLit>_>::~unique_ptr
              ((unique_ptr<AST::StringLit,_std::default_delete<AST::StringLit>_> *)
               ((long)&lit_1.field_2 + 8));
    std::__cxx11::string::~string(local_60);
  }
  else if ((in_RSI->m_currToken).type == Integer) {
    std::__cxx11::string::string(local_88,(string *)&(in_RSI->m_currToken).literal);
    eatToken(in_RSI,(in_RSI->m_currToken).type);
    std::make_unique<AST::IntegerLit,std::__cxx11::string&>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&lit_2.field_2 + 8));
    std::unique_ptr<AST::Expr,std::default_delete<AST::Expr>>::
    unique_ptr<AST::IntegerLit,std::default_delete<AST::IntegerLit>,void>
              ((unique_ptr<AST::Expr,std::default_delete<AST::Expr>> *)this,
               (unique_ptr<AST::IntegerLit,_std::default_delete<AST::IntegerLit>_> *)
               ((long)&lit_2.field_2 + 8));
    std::unique_ptr<AST::IntegerLit,_std::default_delete<AST::IntegerLit>_>::~unique_ptr
              ((unique_ptr<AST::IntegerLit,_std::default_delete<AST::IntegerLit>_> *)
               ((long)&lit_2.field_2 + 8));
    std::__cxx11::string::~string(local_88);
  }
  else if ((in_RSI->m_currToken).type == Float) {
    std::__cxx11::string::string((string *)(local_b8 + 8),(string *)&(in_RSI->m_currToken).literal);
    eatToken(in_RSI,(in_RSI->m_currToken).type);
    std::make_unique<AST::FloatLit,std::__cxx11::string&>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8);
    std::unique_ptr<AST::Expr,std::default_delete<AST::Expr>>::
    unique_ptr<AST::FloatLit,std::default_delete<AST::FloatLit>,void>
              ((unique_ptr<AST::Expr,std::default_delete<AST::Expr>> *)this,
               (unique_ptr<AST::FloatLit,_std::default_delete<AST::FloatLit>_> *)local_b8);
    std::unique_ptr<AST::FloatLit,_std::default_delete<AST::FloatLit>_>::~unique_ptr
              ((unique_ptr<AST::FloatLit,_std::default_delete<AST::FloatLit>_> *)local_b8);
    std::__cxx11::string::~string((string *)(local_b8 + 8));
  }
  else if ((in_RSI->m_currToken).type == True) {
    eatToken(in_RSI,(in_RSI->m_currToken).type);
    local_c1 = 1;
    std::make_unique<AST::BooleanLit,bool>((bool *)&local_c0);
    std::unique_ptr<AST::Expr,std::default_delete<AST::Expr>>::
    unique_ptr<AST::BooleanLit,std::default_delete<AST::BooleanLit>,void>
              ((unique_ptr<AST::Expr,std::default_delete<AST::Expr>> *)this,&local_c0);
    std::unique_ptr<AST::BooleanLit,_std::default_delete<AST::BooleanLit>_>::~unique_ptr(&local_c0);
  }
  else if ((in_RSI->m_currToken).type == False) {
    eatToken(in_RSI,(in_RSI->m_currToken).type);
    std::make_unique<AST::BooleanLit,bool>((bool *)&local_d0);
    std::unique_ptr<AST::Expr,std::default_delete<AST::Expr>>::
    unique_ptr<AST::BooleanLit,std::default_delete<AST::BooleanLit>,void>
              ((unique_ptr<AST::Expr,std::default_delete<AST::Expr>> *)this,&local_d0);
    std::unique_ptr<AST::BooleanLit,_std::default_delete<AST::BooleanLit>_>::~unique_ptr(&local_d0);
  }
  else if ((in_RSI->m_currToken).type == Identifier) {
    std::make_unique<AST::Identifier,std::__cxx11::string&>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &args.
                super__Vector_base<std::unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_>,_std::allocator<std::unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    eatToken(in_RSI,(in_RSI->m_currToken).type);
    if ((in_RSI->m_currToken).type == LeftParen) {
      std::
      vector<std::unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_>,_std::allocator<std::unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_>_>_>
      ::vector((vector<std::unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_>,_std::allocator<std::unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_>_>_>
                *)&arg);
      eatToken(in_RSI,(in_RSI->m_currToken).type);
      while ((in_RSI->m_currToken).type != RightParen) {
        parseExpr((Parser *)local_100);
        if ((in_RSI->m_currToken).type != RightParen) {
          eatToken(in_RSI,Comma);
        }
        std::
        vector<std::unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_>,_std::allocator<std::unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_>_>_>
        ::push_back((vector<std::unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_>,_std::allocator<std::unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_>_>_>
                     *)&arg,(value_type *)local_100);
        std::unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_>::~unique_ptr
                  ((unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_> *)local_100);
      }
      eatToken(in_RSI,RightParen);
      std::
      make_unique<AST::FnCall,std::unique_ptr<AST::Identifier,std::default_delete<AST::Identifier>>,std::vector<std::unique_ptr<AST::Expr,std::default_delete<AST::Expr>>,std::allocator<std::unique_ptr<AST::Expr,std::default_delete<AST::Expr>>>>>
                ((unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_> *)&local_108,
                 (vector<std::unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_>,_std::allocator<std::unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_>_>_>
                  *)&args.
                     super__Vector_base<std::unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_>,_std::allocator<std::unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::unique_ptr<AST::Expr,std::default_delete<AST::Expr>>::
      unique_ptr<AST::FnCall,std::default_delete<AST::FnCall>,void>
                ((unique_ptr<AST::Expr,std::default_delete<AST::Expr>> *)this,&local_108);
      std::unique_ptr<AST::FnCall,_std::default_delete<AST::FnCall>_>::~unique_ptr(&local_108);
      std::
      vector<std::unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_>,_std::allocator<std::unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_>_>_>
      ::~vector((vector<std::unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_>,_std::allocator<std::unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_>_>_>
                 *)&arg);
    }
    else {
      std::unique_ptr<AST::Expr,std::default_delete<AST::Expr>>::
      unique_ptr<AST::Identifier,std::default_delete<AST::Identifier>,void>
                ((unique_ptr<AST::Expr,std::default_delete<AST::Expr>> *)this,
                 (unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_> *)
                 &args.
                  super__Vector_base<std::unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_>,_std::allocator<std::unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    std::unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_>::~unique_ptr
              ((unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_> *)
               &args.
                super__Vector_base<std::unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_>,_std::allocator<std::unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  else {
    std::unique_ptr<AST::Expr,std::default_delete<AST::Expr>>::
    unique_ptr<std::default_delete<AST::Expr>,void>
              ((unique_ptr<AST::Expr,std::default_delete<AST::Expr>> *)this,(nullptr_t)0x0);
  }
  return (__uniq_ptr_data<AST::Expr,_std::default_delete<AST::Expr>,_true,_true>)
         (__uniq_ptr_data<AST::Expr,_std::default_delete<AST::Expr>,_true,_true>)this;
}

Assistant:

std::unique_ptr<AST::Expr> Parser::parseUnaryExpr() {
    if (m_currToken.type == TokenType::Plus ||
        m_currToken.type == TokenType::Minus ||
        m_currToken.type == TokenType::Bang ||
        m_currToken.type == TokenType::Ampersand) {
        TokenType op = m_currToken.type;
        eatToken(m_currToken.type);
        auto operand = parseUnaryExpr();
        return std::make_unique<AST::UnaryExpr>(op,
                                                std::move(operand));
    } else if (m_currToken.type == TokenType::LeftParen) {
        eatToken(m_currToken.type);
        auto expr = parseExpr();
        eatToken(TokenType::RightParen);
        return expr;
    } else if (m_currToken.type == TokenType::String) {
        std::string lit = m_currToken.literal;
        eatToken(m_currToken.type);
        return std::make_unique<AST::StringLit>(lit);
    } else if (m_currToken.type == TokenType::Integer) {
        std::string lit = m_currToken.literal;
        eatToken(m_currToken.type);
        return std::make_unique<AST::IntegerLit>(lit);
    } else if (m_currToken.type == TokenType::Float) {
        std::string lit = m_currToken.literal;
        eatToken(m_currToken.type);
        return std::make_unique<AST::FloatLit>(lit);
    } else if (m_currToken.type == TokenType::True) {
        eatToken(m_currToken.type);
        return std::make_unique<AST::BooleanLit>(true);
    } else if (m_currToken.type == TokenType::False) {
        eatToken(m_currToken.type);
        return std::make_unique<AST::BooleanLit>(false);
    } else if (m_currToken.type == TokenType::Identifier) {
        auto id = std::make_unique<AST::Identifier>(m_currToken.literal);
        eatToken(m_currToken.type);
        if (m_currToken.type == TokenType::LeftParen) {
            // function call
            std::vector<std::unique_ptr<AST::Expr>> args;
            eatToken(m_currToken.type);
            while (m_currToken.type != TokenType::RightParen) {
                auto arg = parseExpr();
                if (m_currToken.type != TokenType::RightParen) {
                    eatToken(TokenType::Comma);
                }
                args.push_back(std::move(arg));
            }
            eatToken(TokenType::RightParen);
            return std::make_unique<AST::FnCall>(std::move(id), std::move(args));
        }
        return static_cast<std::unique_ptr<AST::Expr>>(std::move(id));
    }
    return nullptr;
}